

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O3

void __thiscall
sentencepiece::SentencePieceText::SentencePieceText(SentencePieceText *this,Arena *arena)

{
  (this->super_MessageLite)._internal_metadata_.ptr_ = arena;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SentencePieceText_0020c568;
  google::protobuf::internal::ExtensionSet::ExtensionSet(&this->_extensions_,arena);
  this->_has_bits_ = (uint32  [1])0x0;
  this->_cached_size_ = (atomic<int>)0x0;
  (this->pieces_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->pieces_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->pieces_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->pieces_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  if (scc_info_SentencePieceText_sentencepiece_2eproto.base.visit_status.super___atomic_base<int>.
      _M_i != 0) {
    google::protobuf::internal::InitSCCImpl(&scc_info_SentencePieceText_sentencepiece_2eproto.base);
  }
  (this->text_).tagged_ptr_.ptr_ = &google::protobuf::internal::fixed_address_empty_string;
  this->score_ = 0.0;
  return;
}

Assistant:

SentencePieceText::SentencePieceText(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(arena),
  _extensions_(arena),
  pieces_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:sentencepiece.SentencePieceText)
}